

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_removingComparatorsWorksHierachically_Test::
TEST_MockComparatorCopierTest_removingComparatorsWorksHierachically_Test
          (TEST_MockComparatorCopierTest_removingComparatorsWorksHierachically_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockComparatorCopierTest::TEST_GROUP_CppUTestGroupMockComparatorCopierTest
            (&this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest);
  (this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002bbda0;
  return;
}

Assistant:

TEST(MockComparatorCopierTest, removingComparatorsWorksHierachically)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(1);
    MyTypeForTestingComparator comparator;

    mock("scope").installComparator("MyTypeForTesting", comparator);
    mock().removeAllComparatorsAndCopiers();
    mock("scope").expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock("scope").actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    MockNoWayToCompareCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}